

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_construct_destruct_noMemoryAvailable_fn(int _i)

{
  void *pvVar1;
  char **ppcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *local_20;
  undefined8 local_18;
  undefined8 auStack_10 [2];
  
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  private_ACUtilsTest_ADynArray_freeCount = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  auStack_10[0] = 0x10a5da;
  pvVar1 = private_ACUtils_ADynArray_constructWithAllocator
                     (1,private_ACUtilsTest_ADynArray_realloc,private_ACUtilsTest_ADynArray_free);
  if (pvVar1 == (void *)0x0) {
    auStack_10[0] = 0x10a5f4;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5c);
    if (private_ACUtilsTest_ADynArray_reallocCount != 0) {
      pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
      pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
      iVar3 = 0x5d;
      sVar8 = private_ACUtilsTest_ADynArray_reallocCount;
LAB_0010a772:
      auStack_10[0] = 0;
      local_18 = 0;
      local_20 = "0";
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,iVar3,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar4,pcVar6,sVar8);
    }
    auStack_10[0] = 0x10a615;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5d);
    if (private_ACUtilsTest_ADynArray_freeCount != 0) {
      pcVar4 = "private_ACUtilsTest_ADynArray_freeCount == 0";
      pcVar6 = "private_ACUtilsTest_ADynArray_freeCount";
      iVar3 = 0x5e;
      sVar8 = private_ACUtilsTest_ADynArray_freeCount;
      goto LAB_0010a772;
    }
    auStack_10[0] = 0x10a636;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5e);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 1;
    auStack_10[0] = 0x10a659;
    pvVar1 = private_ACUtils_ADynArray_constructWithAllocator
                       (1,private_ACUtilsTest_ADynArray_realloc,private_ACUtilsTest_ADynArray_free);
    if (pvVar1 == (void *)0x0) {
      auStack_10[0] = 0x10a673;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x62);
      if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
        auStack_10[0] = 0x10a695;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,99);
        if (private_ACUtilsTest_ADynArray_freeCount == 1) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,100);
          return;
        }
        pcVar5 = "private_ACUtilsTest_ADynArray_freeCount == 1";
        pcVar7 = "private_ACUtilsTest_ADynArray_freeCount";
        iVar3 = 100;
        pvVar1 = (void *)private_ACUtilsTest_ADynArray_freeCount;
      }
      else {
        pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
        pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount";
        iVar3 = 99;
        pvVar1 = (void *)private_ACUtilsTest_ADynArray_reallocCount;
      }
      pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      local_18 = 1;
      ppcVar2 = &local_20;
      local_20 = "1";
      goto LAB_0010a812;
    }
    iVar3 = 0x62;
  }
  else {
    iVar3 = 0x5c;
  }
  pcVar7 = "(void*) array";
  pcVar5 = "(void*) array == NULL";
  pcVar6 = "Assertion \'_ck_x == NULL\' failed";
  pcVar4 = "Assertion \'%s\' failed: %s == %#x";
  ppcVar2 = (char **)auStack_10;
LAB_0010a812:
  auStack_10[0] = 0;
  *(void **)((long)ppcVar2 + -8) = pvVar1;
  *(code **)((long)ppcVar2 + -0x10) = test_ADynArray_construct_destruct_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar3,pcVar6,pcVar4,pcVar5,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_construct_destruct_noMemoryAvailable)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_freeCount = 0;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray,
            private_ACUtilsTest_ADynArray_realloc, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_PTR_NULL(array);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_freeCount, 0);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 1;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray,
            private_ACUtilsTest_ADynArray_realloc, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_PTR_NULL(array);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_freeCount, 1);
}